

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmbbt.c
# Opt level: O0

void bitblt(DLword *srcbase,DLword *dstbase,int sx,int dx,int w,int h,int srcbpl,int dstbpl,
           int backwardflg,int src_comp,int op,int gray,int num_gray,int curr_gray_line)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  int iVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint local_178;
  int local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_f4;
  int local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  uint local_b8;
  int srcRshift;
  uint newS;
  uint savedS;
  uint shS;
  uint *src32addr;
  uint *dst32addr;
  uint sdw_mask;
  uint postloop_mask;
  uint preloop_mask;
  int bb_fast;
  uint *OrigDstAddr;
  uint *OrigSrcAddr;
  int fwd;
  int src32rbit;
  int dst32rbit;
  int abc;
  UNSIGNED x32ia;
  UNSIGNED x32nbyt;
  UNSIGNED x32byta;
  uint local_48;
  uint mask;
  uint dstdata;
  uint dstold;
  uint srcRmask;
  int dst32lbit;
  int srcLshift;
  int src32lbit;
  int dstnumL;
  int num_lines_remaining;
  int h_local;
  int w_local;
  int dx_local;
  int sx_local;
  DLword *dstbase_local;
  DLword *srcbase_local;
  sbyte sVar4;
  
  srcRmask = 0;
  dstdata = 0;
  OrigSrcAddr._4_4_ = 0;
  OrigDstAddr = (uint *)0x0;
  srcRshift = 0;
  local_b8 = 0;
  bVar9 = backwardflg != 0;
  uVar1 = (srcbpl | dstbpl) & 0x1f;
  if (gray == 0) {
    if (bVar9) {
      uVar2 = (dx + w) - 1;
      if ((int)uVar2 < 0) {
        lVar8 = -(long)((int)(7 - uVar2) >> 3);
      }
      else {
        lVar8 = (long)((int)uVar2 >> 3);
      }
      x32nbyt = (long)dstbase + lVar8;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      fwd = (int)((x32nbyt & 3) << 3) + (uVar2 & 7);
      dstold = (fwd - w) + 1U & 0x1f;
      sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
      if (dstold == 0) {
        local_ec = 0xffffffff;
      }
      else {
        local_ec = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      dst32addr._4_4_ = local_ec;
      dst32addr._0_4_ = sdw_mask & local_ec;
      if ((w - fwd) + -1 < 1) {
        local_f0 = 0;
      }
      else {
        local_f0 = (w - fwd) + -1 >> 5;
      }
      srcLshift = local_f0;
      uVar2 = (sx + w) - 1;
      if ((int)uVar2 < 0) {
        lVar8 = -(long)((int)(7 - uVar2) >> 3);
      }
      else {
        lVar8 = (long)((int)uVar2 >> 3);
      }
      x32nbyt = (long)srcbase + lVar8;
      OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
      OrigSrcAddr._4_4_ = (int)((x32nbyt & 3) << 3) + (uVar2 & 7);
      dst32lbit = (OrigSrcAddr._4_4_ - w) + 1 & 0x1f;
      local_b8 = dstold - dst32lbit;
      srcRmask = dst32lbit - dstold & 0x1f;
      if (srcRmask == 0) {
        local_f4 = 0;
      }
      else {
        local_f4 = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_f4;
    }
    else {
      if (dx < 0) {
        lVar8 = -(long)(7 - dx >> 3);
      }
      else {
        lVar8 = (long)(dx >> 3);
      }
      x32nbyt = (long)dstbase + lVar8;
      _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
      dstold = (int)((x32nbyt & 3) << 3) + (dx & 7U);
      fwd = (dstold + w) - 1 & 0x1f;
      if (dstold == 0) {
        local_e4 = 0xffffffff;
      }
      else {
        local_e4 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
      }
      sdw_mask = local_e4;
      dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
      dst32addr._0_4_ = local_e4 & dst32addr._4_4_;
      srcLshift = ((int)(dstold + w) >> 5) + -1;
      if (sx < 0) {
        lVar8 = -(long)(7 - sx >> 3);
      }
      else {
        lVar8 = (long)(sx >> 3);
      }
      x32nbyt = (long)srcbase + lVar8;
      OrigDstAddr = (uint *)(x32nbyt - (x32nbyt & 3));
      dst32lbit = (int)((x32nbyt & 3) << 3) + (sx & 7U);
      OrigSrcAddr._4_4_ = (dst32lbit + w) - 1U & 0x1f;
      local_b8 = dstold - dst32lbit;
      srcRmask = dst32lbit - dstold & 0x1f;
      if (srcRmask == 0) {
        local_e8 = 0xffffffff;
      }
      else {
        local_e8 = -1 << (sbyte)srcRmask ^ 0xffffffff;
      }
      dstdata = local_e8;
    }
    local_b8 = local_b8 & 0x1f;
  }
  else {
    if (dx < 0) {
      lVar8 = -(long)(7 - dx >> 3);
    }
    else {
      lVar8 = (long)(dx >> 3);
    }
    x32nbyt = (long)dstbase + lVar8;
    _preloop_mask = (uint *)(x32nbyt - (x32nbyt & 3));
    dstold = (int)((x32nbyt & 3) << 3) + (dx & 7U);
    fwd = (dstold + w) - 1 & 0x1f;
    if (dstold == 0) {
      local_e0 = 0xffffffff;
    }
    else {
      local_e0 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
    }
    sdw_mask = local_e0;
    dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
    dst32addr._0_4_ = local_e0 & dst32addr._4_4_;
    srcLshift = ((int)(dstold + w) >> 5) + -1;
    uVar1 = dstbpl & 0x1f;
    dst32lbit = sx & 0xf;
  }
  bVar10 = uVar1 != 0;
  _savedS = OrigDstAddr;
  src32lbit = h;
  dstbase_local = srcbase;
  do {
    src32addr = _preloop_mask;
    iVar5 = src32lbit + -1;
    if (src32lbit < 1) {
      return;
    }
    if (gray == 0) {
      sVar3 = (sbyte)local_b8;
      sVar4 = (sbyte)srcRmask;
      if (bVar9) {
        if ((OrigSrcAddr._4_4_ < (uint)fwd) && ((int)(dstold + 1) < dst32lbit + w)) {
          puVar7 = _savedS + -1;
          uVar1 = *_savedS;
          _savedS = _savedS + -2;
          newS = uVar1 >> sVar3 & dstdata | *puVar7 << sVar4;
          srcRshift = *puVar7 >> sVar3 & dstdata;
        }
        else {
          if (OrigSrcAddr._4_4_ < (uint)fwd) {
            newS = *_savedS >> sVar3 & dstdata;
          }
          else {
            newS = *_savedS << sVar4;
            srcRshift = *_savedS >> sVar3 & dstdata;
          }
          _savedS = _savedS + -1;
        }
        if (src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        if ((int)(dstold + w) < 0x21) {
          x32byta._4_4_ = (uint)dst32addr;
        }
        else {
          local_48 = *_preloop_mask;
          uVar1 = local_48 & ~sdw_mask;
          switch(op) {
          case 0:
            local_48 = newS;
            break;
          case 1:
            local_48 = newS & local_48;
            break;
          case 2:
            local_48 = newS | local_48;
            break;
          case 3:
            local_48 = newS ^ local_48;
          }
          *_preloop_mask = uVar1 | sdw_mask & local_48;
          src32addr = _preloop_mask + -1;
          if (dst32lbit == dstold) {
            if (src_comp == 0) {
              switch(op) {
              case 0:
                local_d4 = srcLshift;
                while (local_d4 = local_d4 + -1, -1 < local_d4) {
                  *src32addr = *_savedS;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_d4 = srcLshift;
                while (local_d4 = local_d4 + -1, -1 < local_d4) {
                  *src32addr = *_savedS & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_d4 = srcLshift;
                while (local_d4 = local_d4 + -1, -1 < local_d4) {
                  *src32addr = *_savedS | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_d4 = srcLshift;
                while (local_d4 = local_d4 + -1, -1 < local_d4) {
                  *src32addr = *_savedS ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
            else {
              switch(op) {
              case 0:
                local_d0 = srcLshift;
                while (local_d0 = local_d0 + -1, -1 < local_d0) {
                  *src32addr = *_savedS ^ 0xffffffff;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 1:
                local_d0 = srcLshift;
                while (local_d0 = local_d0 + -1, -1 < local_d0) {
                  *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 2:
                local_d0 = srcLshift;
                while (local_d0 = local_d0 + -1, -1 < local_d0) {
                  *src32addr = *_savedS ^ 0xffffffff | *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
                break;
              case 3:
                local_d0 = srcLshift;
                while (local_d0 = local_d0 + -1, -1 < local_d0) {
                  *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
                  _savedS = _savedS + -1;
                  src32addr = src32addr + -1;
                }
              }
            }
          }
          else if (src_comp == 0) {
            switch(op) {
            case 0:
              local_dc = srcLshift;
              while (local_dc = local_dc + -1, -1 < local_dc) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_dc = srcLshift;
              while (local_dc = local_dc + -1, -1 < local_dc) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_dc = srcLshift;
              while (local_dc = local_dc + -1, -1 < local_dc) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_dc = srcLshift;
              while (local_dc = local_dc + -1, -1 < local_dc) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          else {
            switch(op) {
            case 0:
              local_d8 = srcLshift;
              while (local_d8 = local_d8 + -1, -1 < local_d8) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 ^ 0xffffffff;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 1:
              local_d8 = srcLshift;
              while (local_d8 = local_d8 + -1, -1 < local_d8) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 2:
              local_d8 = srcLshift;
              while (local_d8 = local_d8 + -1, -1 < local_d8) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 ^ 0xffffffff | *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
              break;
            case 3:
              local_d8 = srcLshift;
              while (local_d8 = local_d8 + -1, -1 < local_d8) {
                uVar1 = srcRshift | *_savedS << sVar4;
                srcRshift = *_savedS >> sVar3;
                *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
                _savedS = _savedS + -1;
                src32addr = src32addr + -1;
              }
            }
          }
          if (dstold == 0) goto LAB_0010e2ac;
          if ((uint)dst32lbit < dstold) {
            newS = srcRshift;
          }
          else {
            newS = srcRshift | *_savedS << sVar4;
          }
          if (src_comp != 0) {
            newS = newS ^ 0xffffffff;
          }
          x32byta._4_4_ = dst32addr._4_4_;
        }
        goto LAB_0010e21b;
      }
      if ((dstold < (uint)dst32lbit) && (0x20 < dst32lbit + w)) {
        puVar7 = _savedS + 1;
        uVar1 = *_savedS;
        _savedS = _savedS + 2;
        newS = uVar1 << sVar4 | *puVar7 >> sVar3 & dstdata;
        srcRshift = *puVar7 << sVar4 & (dstdata ^ 0xffffffff);
      }
      else {
        if (dstold < (uint)dst32lbit) {
          newS = *_savedS << sVar4;
        }
        else {
          newS = *_savedS >> sVar3 & dstdata;
          srcRshift = *_savedS << sVar4 & (dstdata ^ 0xffffffff);
        }
        _savedS = _savedS + 1;
      }
      if (src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
        goto LAB_0010e21b;
      }
      local_48 = *_preloop_mask;
      uVar1 = local_48 & ~sdw_mask;
      switch(op) {
      case 0:
        local_48 = newS;
        break;
      case 1:
        local_48 = newS & local_48;
        break;
      case 2:
        local_48 = newS | local_48;
        break;
      case 3:
        local_48 = newS ^ local_48;
      }
      *_preloop_mask = uVar1 | sdw_mask & local_48;
      src32addr = _preloop_mask + 1;
      if (dst32lbit == dstold) {
        if (src_comp == 0) {
          switch(op) {
          case 0:
            local_c4 = srcLshift;
            while (local_c4 = local_c4 + -1, -1 < local_c4) {
              *src32addr = *_savedS;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_c4 = srcLshift;
            while (local_c4 = local_c4 + -1, -1 < local_c4) {
              *src32addr = *_savedS & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_c4 = srcLshift;
            while (local_c4 = local_c4 + -1, -1 < local_c4) {
              *src32addr = *_savedS | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_c4 = srcLshift;
            while (local_c4 = local_c4 + -1, -1 < local_c4) {
              *src32addr = *_savedS ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
        else {
          switch(op) {
          case 0:
            local_c0 = srcLshift;
            while (local_c0 = local_c0 + -1, -1 < local_c0) {
              *src32addr = *_savedS ^ 0xffffffff;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 1:
            local_c0 = srcLshift;
            while (local_c0 = local_c0 + -1, -1 < local_c0) {
              *src32addr = (*_savedS ^ 0xffffffff) & *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 2:
            local_c0 = srcLshift;
            while (local_c0 = local_c0 + -1, -1 < local_c0) {
              *src32addr = *_savedS ^ 0xffffffff | *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
            break;
          case 3:
            local_c0 = srcLshift;
            while (local_c0 = local_c0 + -1, -1 < local_c0) {
              *src32addr = *_savedS ^ 0xffffffff ^ *src32addr;
              _savedS = _savedS + 1;
              src32addr = src32addr + 1;
            }
          }
        }
      }
      else if (src_comp == 0) {
        switch(op) {
        case 0:
          local_cc = srcLshift;
          while (local_cc = local_cc + -1, -1 < local_cc) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_cc = srcLshift;
          while (local_cc = local_cc + -1, -1 < local_cc) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_cc = srcLshift;
          while (local_cc = local_cc + -1, -1 < local_cc) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_cc = srcLshift;
          while (local_cc = local_cc + -1, -1 < local_cc) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      else {
        switch(op) {
        case 0:
          local_c8 = srcLshift;
          while (local_c8 = local_c8 + -1, -1 < local_c8) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 ^ 0xffffffff;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_c8 = srcLshift;
          while (local_c8 = local_c8 + -1, -1 < local_c8) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = (uVar1 ^ 0xffffffff) & *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_c8 = srcLshift;
          while (local_c8 = local_c8 + -1, -1 < local_c8) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 ^ 0xffffffff | *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_c8 = srcLshift;
          while (local_c8 = local_c8 + -1, -1 < local_c8) {
            uVar1 = srcRshift | *_savedS >> sVar3;
            srcRshift = *_savedS << sVar4;
            *src32addr = uVar1 ^ 0xffffffff ^ *src32addr;
            _savedS = _savedS + 1;
            src32addr = src32addr + 1;
          }
        }
      }
      if (fwd != 0x1f) {
        if ((uint)fwd < OrigSrcAddr._4_4_) {
          newS = srcRshift;
        }
        else {
          newS = srcRshift | *_savedS >> sVar3 & dstdata;
        }
        if (src_comp != 0) {
          newS = newS ^ 0xffffffff;
        }
        x32byta._4_4_ = dst32addr._4_4_;
        goto LAB_0010e21b;
      }
    }
    else {
      srcRmask = dst32lbit - dstold & 0xf;
      uVar1 = CONCAT22(*dstbase_local,*dstbase_local) << (sbyte)srcRmask;
      newS = uVar1 >> 0x10 | uVar1;
      if (src_comp != 0) {
        newS = newS ^ 0xffffffff;
      }
      if ((int)(dstold + w) < 0x21) {
        x32byta._4_4_ = (uint)dst32addr;
      }
      else {
        local_48 = *_preloop_mask;
        uVar1 = local_48 & ~sdw_mask;
        switch(op) {
        case 0:
          local_48 = newS;
          break;
        case 1:
          local_48 = newS & local_48;
          break;
        case 2:
          local_48 = newS | local_48;
          break;
        case 3:
          local_48 = newS ^ local_48;
        }
        *_preloop_mask = local_48 & sdw_mask | uVar1;
        src32addr = _preloop_mask + 1;
        switch(op) {
        case 0:
          local_bc = srcLshift;
          while (local_bc = local_bc + -1, -1 < local_bc) {
            *src32addr = newS;
            src32addr = src32addr + 1;
          }
          break;
        case 1:
          local_bc = srcLshift;
          while (local_bc = local_bc + -1, -1 < local_bc) {
            *src32addr = newS & *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 2:
          local_bc = srcLshift;
          while (local_bc = local_bc + -1, -1 < local_bc) {
            *src32addr = newS | *src32addr;
            src32addr = src32addr + 1;
          }
          break;
        case 3:
          local_bc = srcLshift;
          while (local_bc = local_bc + -1, -1 < local_bc) {
            *src32addr = newS ^ *src32addr;
            src32addr = src32addr + 1;
          }
        }
        if (fwd == 0x1f) goto LAB_0010e2ac;
        x32byta._4_4_ = dst32addr._4_4_;
      }
LAB_0010e21b:
      local_48 = *src32addr;
      uVar1 = local_48 & ~x32byta._4_4_;
      switch(op) {
      case 0:
        local_48 = newS;
        break;
      case 1:
        local_48 = newS & local_48;
        break;
      case 2:
        local_48 = newS | local_48;
        break;
      case 3:
        local_48 = newS ^ local_48;
      }
      *src32addr = uVar1 | x32byta._4_4_ & local_48;
    }
LAB_0010e2ac:
    iVar6 = dstbpl >> 5;
    src32lbit = iVar5;
    if (gray == 0) {
      iVar5 = srcbpl >> 5;
      if (bVar9) {
        if (bVar10) {
          uVar1 = dstbpl + fwd;
          if ((int)uVar1 < 0) {
            lVar8 = (long)((int)(0x1f - uVar1) >> 5) * -4;
          }
          else {
            lVar8 = (long)((int)dstold >> 5) * 4;
          }
          fwd = uVar1 & 0x1f;
          dstold = (fwd - w) + 1U & 0x1f;
          sdw_mask = -1 << (0x1fU - (char)fwd & 0x1f);
          if (dstold == 0) {
            local_170 = 0xffffffff;
          }
          else {
            local_170 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          dst32addr._4_4_ = local_170;
          dst32addr._0_4_ = sdw_mask & local_170;
          if ((w - fwd) + -1 < 1) {
            local_174 = 0;
          }
          else {
            local_174 = (w - fwd) + -1 >> 5;
          }
          srcLshift = local_174;
        }
        else {
          lVar8 = (long)iVar6 * 4;
        }
        src32addr = (uint *)((long)_preloop_mask + lVar8);
        if (bVar10) {
          uVar1 = srcbpl + OrigSrcAddr._4_4_;
          if ((int)uVar1 < 0) {
            lVar8 = (long)((int)(0x1f - uVar1) >> 5) * -4;
          }
          else {
            lVar8 = (long)((int)uVar1 >> 5) * 4;
          }
          OrigSrcAddr._4_4_ = uVar1 & 0x1f;
          dst32lbit = (OrigSrcAddr._4_4_ - w) + 1 & 0x1f;
          local_b8 = dstold - dst32lbit & 0x1f;
          srcRmask = dst32lbit - dstold & 0x1f;
          if (srcRmask == 0) {
            local_178 = 0;
          }
          else {
            local_178 = -1 << (sbyte)srcRmask ^ 0xffffffff;
          }
          dstdata = local_178;
        }
        else {
          lVar8 = (long)iVar5 * 4;
        }
        _savedS = (uint *)((long)OrigDstAddr + lVar8);
        _preloop_mask = src32addr;
        OrigDstAddr = _savedS;
      }
      else {
        if (bVar10) {
          iVar6 = (int)(dstbpl + dstold) >> 5;
          dstold = dstbpl + dstold & 0x1f;
          fwd = (dstold + w) - 1 & 0x1f;
          if (dstold == 0) {
            local_168 = 0xffffffff;
          }
          else {
            local_168 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
          }
          sdw_mask = local_168;
          dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
          dst32addr._0_4_ = local_168 & dst32addr._4_4_;
          srcLshift = ((int)(dstold + w) >> 5) + -1;
        }
        _preloop_mask = _preloop_mask + iVar6;
        if (bVar10) {
          iVar5 = srcbpl + dst32lbit >> 5;
          dst32lbit = srcbpl + dst32lbit & 0x1f;
          OrigSrcAddr._4_4_ = (dst32lbit + w) - 1U & 0x1f;
          local_b8 = dstold - dst32lbit & 0x1f;
          srcRmask = dst32lbit - dstold & 0x1f;
          if (srcRmask == 0) {
            local_16c = 0xffffffff;
          }
          else {
            local_16c = -1 << (sbyte)srcRmask ^ 0xffffffff;
          }
          dstdata = local_16c;
        }
        OrigDstAddr = OrigDstAddr + iVar5;
        _savedS = OrigDstAddr;
      }
    }
    else {
      if (bVar10) {
        iVar6 = (int)(dstbpl + dstold) >> 5;
        dstold = dstbpl + dstold & 0x1f;
        fwd = (dstold + w) - 1 & 0x1f;
        if (dstold == 0) {
          local_164 = 0xffffffff;
        }
        else {
          local_164 = -1 << (0x20U - (char)dstold & 0x1f) ^ 0xffffffff;
        }
        sdw_mask = local_164;
        dst32addr._4_4_ = -1 << (0x1fU - (char)fwd & 0x1f);
        dst32addr._0_4_ = local_164 & dst32addr._4_4_;
        srcLshift = ((int)(dstold + w) >> 5) + -1;
      }
      _preloop_mask = _preloop_mask + iVar6;
      curr_gray_line = curr_gray_line + 1;
      if (curr_gray_line < num_gray) {
        dstbase_local = dstbase_local + 1;
      }
      else {
        curr_gray_line = 0;
        dstbase_local = dstbase_local + -(long)(num_gray + -1);
      }
    }
  } while( true );
}

Assistant:

void bitblt(DLword *srcbase, DLword *dstbase, int sx, int dx, int w, int h, int srcbpl, int dstbpl,
            int backwardflg, int src_comp, int op, int gray, int num_gray, int curr_gray_line) {
  new_bitblt_code;
}